

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrecord.cpp
# Opt level: O1

void __thiscall QSqlRecord::clearValues(QSqlRecord *this)

{
  QSqlRecordPrivate *pQVar1;
  iterator this_00;
  iterator iVar2;
  QSqlField *f;
  QList<QSqlField> *this_01;
  
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 != (QSqlRecordPrivate *)0x0) &&
     ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1)) {
    QExplicitlySharedDataPointer<QSqlRecordPrivate>::detach_helper(&this->d);
  }
  this_01 = &((this->d).d.ptr)->fields;
  this_00 = QList<QSqlField>::begin(this_01);
  iVar2 = QList<QSqlField>::end(this_01);
  for (; this_00.i != iVar2.i; this_00.i = this_00.i + 1) {
    QSqlField::clear(this_00.i);
  }
  return;
}

Assistant:

void QSqlRecord::clearValues()
{
    detach();
    for (QSqlField &f : d->fields)
        f.clear();
}